

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElasticityReissnerGeneric::ComputeStress
          (ChElasticityReissnerGeneric *this,ChVector<double> *n_u,ChVector<double> *n_v,
          ChVector<double> *m_u,ChVector<double> *m_v,ChVector<double> *eps_u,
          ChVector<double> *eps_v,ChVector<double> *kur_u,ChVector<double> *kur_v,double z_inf,
          double z_sup,double angle)

{
  ChVectorN<double,_12> mstress;
  ChVectorN<double,_12> mstrain;
  Product<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_Eigen::Matrix<double,_12,_1,_0,_12,_1>,_0>
  local_158 [3];
  Matrix<double,_12,_1,_0,_12,_1> local_120;
  Matrix<double,_12,_1,_0,_12,_1> local_c0;
  
  local_158[0].m_lhs = (LhsNested)eps_u;
  Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_120,&local_c0,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_120,
             (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_158);
  local_158[0].m_lhs = (LhsNested)eps_v;
  Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_120,&local_c0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_120,
             (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_158);
  local_158[0].m_lhs = (LhsNested)kur_u;
  Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_120,&local_c0,6,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_120,
             (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_158);
  local_158[0].m_lhs = (LhsNested)kur_v;
  Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)&local_120,&local_c0,9,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,12,1,0,12,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false> *)&local_120,
             (Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_158);
  local_158[0].m_lhs = &this->mE;
  local_158[0].m_rhs = &local_c0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,12,1,0,12,1>,Eigen::Product<Eigen::Matrix<double,12,12,1,12,12>,Eigen::Matrix<double,12,1,0,12,1>,0>>
            (&local_120,local_158);
  Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_158,&local_120,0,3);
  ChVector<double>::operator=
            (n_u,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 local_158);
  Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_158,&local_120,3,3);
  ChVector<double>::operator=
            (n_v,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 local_158);
  Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_158,&local_120,6,3);
  ChVector<double>::operator=
            (m_u,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 local_158);
  Eigen::VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1> *)local_158,&local_120,9,3);
  ChVector<double>::operator=
            (m_v,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 local_158);
  return;
}

Assistant:

void ChElasticityReissnerGeneric::ComputeStress(
	ChVector<>& n_u,          ///< forces along \e u direction (per unit length)
	ChVector<>& n_v,          ///< forces along \e v direction (per unit length)
	ChVector<>& m_u,          ///< torques along \e u direction (per unit length)
	ChVector<>& m_v,          ///< torques along \e v direction (per unit length)
	const ChVector<>& eps_u,  ///< strains along \e u direction
	const ChVector<>& eps_v,  ///< strains along \e v direction
	const ChVector<>& kur_u,  ///< curvature along \e u direction
	const ChVector<>& kur_v,  ///< curvature along \e v direction
	const double z_inf,       ///< layer lower z value (along thickness coord)
	const double z_sup,       ///< layer upper z value (along thickness coord)
	const double angle        ///< layer angle respect to x (if needed) -not used in this, isotropic
) {
	ChVectorN<double, 12> mstrain;
    ChVectorN<double, 12> mstress;
    mstrain.segment(0 , 3) = eps_u.eigen();
	mstrain.segment(3 , 3) = eps_v.eigen();
    mstrain.segment(6 , 3) = kur_u.eigen();
	mstrain.segment(9 , 3) = kur_v.eigen();
    mstress = this->mE * mstrain;
    n_u = mstress.segment(0, 3);
	n_v = mstress.segment(3, 3);
	m_u = mstress.segment(6, 3);
	m_v = mstress.segment(9, 3);
}